

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putil.cpp
# Opt level: O0

UBool uprv_add32_overflow_63(int32_t a,int32_t b,int32_t *res)

{
  int64_t res64;
  int64_t b64;
  int64_t a64;
  int32_t *res_local;
  int32_t b_local;
  int32_t a_local;
  
  *res = (int32_t)((long)a + (long)b);
  return (long)a + (long)b != (long)*res;
}

Assistant:

U_CAPI UBool U_EXPORT2
uprv_add32_overflow(int32_t a, int32_t b, int32_t* res) {
    // NOTE: Some compilers (GCC, Clang) have primitives available, like __builtin_add_overflow.
    // This function could be optimized by calling one of those primitives.
    auto a64 = static_cast<int64_t>(a);
    auto b64 = static_cast<int64_t>(b);
    int64_t res64 = a64 + b64;
    *res = static_cast<int32_t>(res64);
    return res64 != *res;
}